

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_ech_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  bool bVar1;
  uint16_t uVar2;
  size_t extraout_RDX;
  Span<const_unsigned_char> ech_config_list;
  
  bVar1 = true;
  if (contents != (CBS *)0x0) {
    ssl = hs->ssl;
    uVar2 = ssl_protocol_version(ssl);
    if ((uVar2 < 0x304) || (ssl->s3->ech_status == ssl_ech_accepted)) {
      *out_alert = 'n';
      bVar1 = false;
      ERR_put_error(0x10,0,0xde,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x25e);
    }
    else {
      ech_config_list.size_ = extraout_RDX;
      ech_config_list.data_ = (uchar *)contents->len;
      bVar1 = ssl_is_valid_ech_config_list((bssl *)contents->data,ech_config_list);
      if (bVar1) {
        if (ssl->s3->ech_status != ssl_ech_rejected) {
          return true;
        }
        bVar1 = Array<unsigned_char>::CopyFrom
                          (&hs->ech_retry_configs,(Span<const_unsigned_char>)*contents);
        if (bVar1) {
          return true;
        }
        *out_alert = 'P';
      }
      else {
        *out_alert = '2';
      }
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

static bool ext_ech_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  // The ECH extension may not be sent in TLS 1.2 ServerHello, only TLS 1.3
  // EncryptedExtensions. It also may not be sent in response to an inner ECH
  // extension.
  if (ssl_protocol_version(ssl) < TLS1_3_VERSION ||
      ssl->s3->ech_status == ssl_ech_accepted) {
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    return false;
  }

  if (!ssl_is_valid_ech_config_list(*contents)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  if (ssl->s3->ech_status == ssl_ech_rejected &&
      !hs->ech_retry_configs.CopyFrom(*contents)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  return true;
}